

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O1

void * SZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_uint8 *pPVar1;
  PHYSFS_uint8 PVar2;
  int iVar3;
  SRes SVar4;
  uint uVar5;
  UInt32 UVar6;
  PHYSFS_ErrorCode PVar7;
  SRes SVar8;
  PHYSFS_uint64 PVar9;
  PHYSFS_sint64 PVar10;
  SZIPinfo *info;
  long lVar11;
  CSzAr *pCVar12;
  UInt32 *allocMain;
  CSzAr *pCVar13;
  CSzAr *alloc;
  ISzAlloc *alloc_00;
  ISzAlloc *in_R8;
  CSzArEx *p;
  CSzArEx *pCVar14;
  CSzAr *pCVar15;
  bool bVar16;
  bool bVar17;
  UInt64 type;
  Int64 startArcPos;
  PHYSFS_uint8 sig [6];
  CSzData sd;
  Int64 pos;
  Byte header [32];
  SZIPLookToRead stream;
  ISzAlloc *in_stack_ffffffffffffbea8;
  UInt64 local_4138;
  _func_void_ptr_void_ptr_size_t *local_4130;
  uint local_4124;
  int local_411e;
  short local_411a;
  CSzAr *local_4118;
  CSzAr *pCStack_4110;
  CSzAr *local_4108;
  CSzAr *local_4100;
  CSzAr local_40f8;
  undefined1 local_40a8 [20];
  CSzAr *local_4094;
  uint local_408c;
  code *local_4080;
  code *local_4078;
  PHYSFS_Io *local_4070;
  ILookInStream local_4068;
  code **local_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  
  if (forWriting == 0) {
    PVar9 = (*io->tell)(io);
    if (PVar9 == 0xffffffffffffffff) {
      return (void *)0x0;
    }
    PVar10 = (*io->read)(io,&local_411e,6);
    if (PVar10 != 6) {
      return (void *)0x0;
    }
    *claimed = (uint)(local_411a == 0x1c27 && local_411e == -0x504385c9);
    iVar3 = (*io->seek)(io,PVar9);
    if (iVar3 == 0) {
      return (void *)0x0;
    }
    info = (SZIPinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0x100);
    if (info != (SZIPinfo *)0x0) {
      p = &info->db;
      memset(info,0,0x100);
      info->io = io;
      local_4080 = SZIP_ISeekInStream_Read;
      local_4078 = SZIP_ISeekInStream_Seek;
      local_4040 = 0;
      uStack_4038 = 0;
      local_4068.Look = LookToRead_Look_Exact;
      local_4068.Skip = LookToRead_Skip;
      local_4068.Read = LookToRead_Read;
      local_4068.Seek = LookToRead_Seek;
      local_4048 = &local_4080;
      alloc = (CSzAr *)&local_4130;
      local_4130 = (_func_void_ptr_void_ptr_size_t *)0x0;
      local_4070 = io;
      SVar4 = LookToRead_Seek(&local_4068,(Int64 *)alloc,SZ_SEEK_CUR);
      SVar8 = SVar4;
      if (SVar4 == 0) {
        pCVar12 = (CSzAr *)local_40a8;
        pCVar13 = (CSzAr *)0x20;
        pCVar14 = p;
        do {
          if (pCVar13 == (CSzAr *)0x0) {
            SVar8 = 0;
            break;
          }
          alloc = pCVar12;
          local_40f8._0_8_ = pCVar13;
          uVar5 = (*local_4068.Read)(&local_4068,pCVar12,(size_t *)&local_40f8);
          pCVar14 = (CSzArEx *)((ulong)pCVar14 & 0xffffffff);
          if (uVar5 == 0) {
            if ((CSzAr *)local_40f8._0_8_ == (CSzAr *)0x0) {
              pCVar14 = (CSzArEx *)0x11;
              goto LAB_0010d8e2;
            }
            pCVar12 = (CSzAr *)((long)&pCVar12->NumPackStreams + local_40f8._0_8_);
            pCVar13 = (CSzAr *)((long)pCVar13 - local_40f8._0_8_);
            bVar17 = true;
          }
          else {
            pCVar14 = (CSzArEx *)(ulong)uVar5;
LAB_0010d8e2:
            bVar17 = false;
          }
          SVar8 = (SRes)pCVar14;
        } while (bVar17);
        if (SVar8 == 0) {
          lVar11 = 0;
          do {
            pPVar1 = local_40a8 + lVar11;
            PVar2 = SZIP_openArchive::wantedsig[lVar11];
            alloc = (CSzAr *)CONCAT71((int7)((ulong)alloc >> 8),PVar2);
            if (*pPVar1 != PVar2) break;
            bVar17 = lVar11 != 5;
            lVar11 = lVar11 + 1;
          } while (bVar17);
          if (*pPVar1 == PVar2) {
            SVar8 = 4;
            if (local_40a8[6] != '\0') goto LAB_0010d9cb;
            alloc = (CSzAr *)(local_40a8 + 0xc);
            local_4124 = local_408c;
            (info->db).startPosAfterHeader = (UInt64)(local_4130 + 0x20);
            UVar6 = (*g_CrcUpdate)(0xffffffff,alloc,0x14,g_CrcTable);
            SVar8 = 3;
            if ((UVar6 ^ local_40a8._8_4_) != 0xffffffff) goto LAB_0010d9cb;
            if (local_4094 == (CSzAr *)0x0) {
              SVar8 = 0;
              goto LAB_0010d9cb;
            }
            if (!CARRY8(local_40a8._12_8_,(ulong)local_4094)) {
              SVar8 = 0x11;
              if ((ulong)local_40a8._12_8_ <= -(long)local_4094 - 0x21U) {
                alloc = &local_40f8;
                local_40f8._0_8_ = (CSzAr *)0x0;
                SVar8 = (*local_4068.Seek)(&local_4068,(Int64 *)alloc,SZ_SEEK_END);
                if (SVar8 == 0) {
                  if ((ulong)local_40f8._0_8_ < (CSzAr *)(local_4130 + local_40a8._12_8_)) {
                    SVar4 = 6;
                    bVar17 = false;
                  }
                  else {
                    bVar16 = (CSzAr *)((long)&((CSzAr *)(local_4130 + local_40a8._12_8_))->
                                              FoCodersOffsets + (long)local_4094) <=
                             (ulong)local_40f8._0_8_;
                    bVar17 = bVar16 && (CSzAr *)(local_4130 + local_40a8._12_8_ + 0x20) <=
                                       (ulong)local_40f8._0_8_;
                    alloc = local_4094;
                    if (!bVar16 ||
                        (CSzAr *)(local_4130 + local_40a8._12_8_ + 0x20) > (ulong)local_40f8._0_8_)
                    {
                      SVar4 = 6;
                    }
                  }
                }
                else {
                  bVar17 = false;
                  SVar4 = SVar8;
                }
                SVar8 = SVar4;
                if (bVar17) {
                  local_40f8._0_8_ = local_4130 + local_40a8._12_8_ + 0x20;
                  alloc = &local_40f8;
                  SVar8 = (*local_4068.Seek)(&local_4068,(Int64 *)alloc,SZ_SEEK_SET);
                  if (SVar8 == 0) {
                    alloc = local_4094;
                    pCVar12 = (CSzAr *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)local_4094);
                    pCVar13 = pCVar12;
                    pCVar15 = local_4094;
                    if (pCVar12 == (CSzAr *)0x0) {
                      SVar8 = 2;
                    }
                    else {
                      do {
                        if (pCVar15 == (CSzAr *)0x0) {
                          SVar4 = 0;
                          break;
                        }
                        local_40f8._0_8_ = pCVar15;
                        SVar8 = (*local_4068.Read)(&local_4068,pCVar13,(size_t *)&local_40f8);
                        if (SVar8 == 0) {
                          if ((CSzAr *)local_40f8._0_8_ == (CSzAr *)0x0) {
                            SVar8 = 6;
                            goto LAB_0010db4f;
                          }
                          pCVar13 = (CSzAr *)((long)&pCVar13->NumPackStreams + local_40f8._0_8_);
                          pCVar15 = (CSzAr *)((long)pCVar15 - local_40f8._0_8_);
                          bVar17 = true;
                        }
                        else {
LAB_0010db4f:
                          SVar4 = SVar8;
                          bVar17 = false;
                        }
                      } while (bVar17);
                      alloc = pCVar12;
                      SVar8 = SVar4;
                      if (SVar4 == 0) {
                        allocMain = g_CrcTable;
                        UVar6 = (*g_CrcUpdate)(0xffffffff,pCVar12,(size_t)local_4094,g_CrcTable);
                        SVar8 = 0x10;
                        if ((UVar6 ^ local_4124) == 0xffffffff) {
                          local_4108 = pCVar12;
                          local_4100 = local_4094;
                          SVar8 = ReadNumber((CSzData *)&local_4108,&local_4138);
                          if ((SVar8 == 0) && (local_4138 == 0x17)) {
                            local_4118 = (CSzAr *)0x0;
                            pCStack_4110 = (CSzAr *)0x0;
                            local_40f8._0_8_ = (CSzAr *)0x0;
                            local_40f8.PackPositions = (UInt64 *)0x0;
                            local_40f8.FolderCRCs.Defs = (Byte *)0x0;
                            local_40f8.FolderCRCs.Vals = (UInt32 *)0x0;
                            local_40f8.FoCodersOffsets = (size_t *)0x0;
                            local_40f8.FoStartPackStreamIndex = (UInt32 *)0x0;
                            local_40f8.FoToCoderUnpackSizes = (UInt32 *)0x0;
                            local_40f8.FoToMainUnpackSizeIndex = (Byte *)0x0;
                            local_40f8.CoderUnpackSizes = (UInt64 *)0x0;
                            local_40f8.CodersData = (Byte *)0x0;
                            in_R8 = (ISzAlloc *)(info->db).startPosAfterHeader;
                            alloc_00 = (ISzAlloc *)&local_4108;
                            allocMain = (UInt32 *)0x1;
                            SVar8 = SzReadAndDecodePackedStreams
                                              (&local_4068,(CSzData *)alloc_00,(CBuf *)&local_4118,1
                                               ,(UInt64)in_R8,&local_40f8,in_stack_ffffffffffffbea8)
                            ;
                            SzAr_Free(&local_40f8,alloc_00);
                            if (SVar8 == 0) {
                              (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,pCVar12);
                              pCVar12 = local_4118;
                              local_4108 = local_4118;
                              local_4100 = pCStack_4110;
                              allocMain = &local_4118->NumPackStreams;
                              SVar8 = ReadNumber((CSzData *)&local_4108,&local_4138);
                            }
                            else {
                              (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_4118);
                              local_4118 = (CSzAr *)0x0;
                              pCStack_4110 = (CSzAr *)0x0;
                            }
                          }
                          alloc = pCVar12;
                          if ((SVar8 == 0) && (SVar8 = 4, local_4138 == 1)) {
                            SVar8 = SzReadHeader(p,(CSzData *)&local_4108,&local_4068,
                                                 (ISzAlloc *)allocMain,in_R8);
                          }
                        }
                      }
                      (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,alloc);
                    }
                  }
                }
              }
              goto LAB_0010d9cb;
            }
          }
          SVar8 = 0x11;
        }
      }
LAB_0010d9cb:
      if (SVar8 == 0) {
        iVar3 = szipLoadEntries(info);
        if (iVar3 != 0) {
          return info;
        }
      }
      else {
        SzArEx_Free(p,(ISzAlloc *)alloc);
        PVar7 = szipErrorCode(SVar8);
        PHYSFS_setErrorCode(PVar7);
      }
      info->io = (PHYSFS_Io *)0x0;
      SZIP_closeArchive(info);
      return (void *)0x0;
    }
    PVar7 = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  else {
    PVar7 = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(PVar7);
  return (void *)0x0;
}

Assistant:

static void *SZIP_openArchive(PHYSFS_Io *io, const char *name,
                              int forWriting, int *claimed)
{
    static const PHYSFS_uint8 wantedsig[] = { '7','z',0xBC,0xAF,0x27,0x1C };
    SZIPLookToRead stream;
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPinfo *info = NULL;
    SRes rc;
    PHYSFS_uint8 sig[6];
    PHYSFS_sint64 pos;

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    pos = io->tell(io);
    BAIL_IF_ERRPASS(pos == -1, NULL);
    BAIL_IF_ERRPASS(io->read(io, sig, 6) != 6, NULL);
    *claimed = (memcmp(sig, wantedsig, 6) == 0);
    BAIL_IF_ERRPASS(!io->seek(io, pos), NULL);

    info = (SZIPinfo *) allocator.Malloc(sizeof (SZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (*info));

    SzArEx_Init(&info->db);

    info->io = io;

    szipInitStream(&stream, io);
    rc = SzArEx_Open(&info->db, &stream.lookStream.s, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), failed);

    GOTO_IF_ERRPASS(!szipLoadEntries(info), failed);

    return info;

failed:
    info->io = NULL;  /* don't let cleanup destroy the PHYSFS_Io. */
    SZIP_closeArchive(info);
    return NULL;
}